

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O2

void re2::Search(int iters,int nbytes,char *regexp,SearchImpl *search)

{
  string s;
  string local_50;
  StringPiece local_30;
  
  StopBenchmarkTiming();
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  MakeText(&local_50,nbytes);
  BenchmarkMemoryUsage();
  StartBenchmarkTiming();
  local_30.ptr_ = local_50._M_dataplus._M_p;
  local_30.length_ = (int)local_50._M_string_length;
  (*search)(iters,regexp,&local_30,kUnanchored,false);
  SetBenchmarkBytesProcessed((long)nbytes * (long)iters);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void Search(int iters, int nbytes, const char* regexp, SearchImpl* search) {
  StopBenchmarkTiming();
  string s;
  MakeText(&s, nbytes);
  BenchmarkMemoryUsage();
  StartBenchmarkTiming();
  search(iters, regexp, s, Prog::kUnanchored, false);
  SetBenchmarkBytesProcessed(static_cast<int64>(iters)*nbytes);
}